

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

void __thiscall miniros::MasterLink::invalidateParentParams(MasterLink *this,string *key)

{
  bool bVar1;
  iterator iVar2;
  string ns_key;
  string local_70;
  string local_50;
  
  if (this->internal_ != (Internal *)0x0) {
    names::parentNamespace(&local_70,key);
    while( true ) {
      bVar1 = std::operator!=(&local_70,"");
      if (!bVar1) break;
      bVar1 = std::operator!=(&local_70,"/");
      if (!bVar1) break;
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->internal_->subscribed_params)._M_t,&local_70);
      if ((_Rb_tree_header *)iVar2._M_node !=
          &(this->internal_->subscribed_params)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
        ::erase(&(this->internal_->params)._M_t,&local_70);
      }
      names::parentNamespace(&local_50,&local_70);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void MasterLink::invalidateParentParams(const std::string& key)
{
  if (!internal_)
    return;
  std::string ns_key = names::parentNamespace(key);
  while (ns_key != "" && ns_key != "/") {
    if (internal_->subscribed_params.find(ns_key) != internal_->subscribed_params.end()) {
      // by erasing the key the parameter will be re-queried
      internal_->params.erase(ns_key);
    }
    ns_key = names::parentNamespace(ns_key);
  }
}